

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error llvm::createStringError<char_const*,unsigned_long>
                (error_code EC,char *Fmt,char **Vals,unsigned_long *Vals_1)

{
  string *Args;
  llvm *this;
  unsigned_long *Vals_1_00;
  char **in_R9;
  format_object<const_char_*,_unsigned_long> local_b8;
  undefined1 local_88 [8];
  raw_string_ostream Stream;
  string Buffer;
  unsigned_long *Vals_local_1;
  char **Vals_local;
  char *Fmt_local;
  error_code EC_local;
  
  this = EC._0_8_;
  Fmt_local._0_4_ = EC._M_cat._0_4_;
  Vals_1_00 = Vals_1;
  EC_local._0_8_ = Fmt;
  EC_local._M_cat = (error_category *)this;
  std::__cxx11::string::string((string *)&Stream.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_88,(string *)&Stream.OS);
  format<char_const*,unsigned_long>(&local_b8,(llvm *)Vals,(char *)Vals_1,in_R9,Vals_1_00);
  raw_ostream::operator<<((raw_ostream *)local_88,&local_b8.super_format_object_base);
  Args = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_88);
  make_error<llvm::StringError,std::__cxx11::string&,std::error_code&>
            (this,Args,(error_code *)&Fmt_local);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_88);
  std::__cxx11::string::~string((string *)&Stream.OS);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

inline Error createStringError(std::error_code EC, char const *Fmt,
                               const Ts &... Vals) {
  std::string Buffer;
  raw_string_ostream Stream(Buffer);
  Stream << format(Fmt, Vals...);
  return make_error<StringError>(Stream.str(), EC);
}